

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O1

void __thiscall
stateObservation::LipmDcmEstimator::LipmDcmEstimator
          (LipmDcmEstimator *this,double dt,double omega_0,double biasDriftStd,
          double dcmMeasureErrorStd,double zmpMeasureErrorStd,Vector2 *biasLimit,Vector2 *initZMP,
          Vector2 *initDcm,Vector2 *initBias,Vector2 *initDcmUncertainty,
          Vector2 *initBiasUncertainty)

{
  LinearKalmanFilter *this_00;
  double *pdVar1;
  double dVar2;
  undefined8 uVar3;
  Index IVar4;
  ActualDstType actualDst_1;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  *pDVar5;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar6;
  undefined8 *puVar7;
  Matrix4 *pMVar8;
  Matrix24 *pMVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_2,_4,_0,_2,_4> *other;
  double dVar14;
  Matrix4 P;
  Vector4 x;
  DenseStorage<double,__1,__1,__1,_0> local_168;
  long local_150;
  DenseStorage<double,__1,__1,__1,_0> local_148;
  Index local_130 [13];
  Vector2 *local_c8;
  double local_c0;
  double local_b8 [4];
  double local_98;
  double adStack_90 [3];
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_78 [8];
  undefined8 local_70;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_68 [8];
  undefined8 local_60;
  double local_58 [5];
  
  this->omega0_ = omega_0;
  (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  (this->gamma_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  this->kappa_ = 1.0;
  this->dt_ = dt;
  this->biasDriftStd_ = biasDriftStd;
  this->zmpErrorStd_ = zmpMeasureErrorStd;
  this->needUpdateMatrices_ = true;
  dVar14 = (initZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
           array[1];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[0] = (initZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[0];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[1] = dVar14;
  dVar14 = (biasLimit->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
           m_data.array[1];
  (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[0] = (biasLimit->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
             m_data.array[0];
  (this->biasLimit_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
  array[1] = dVar14;
  this_00 = &this->filter_;
  local_c8 = initDcmUncertainty;
  local_c0 = dcmMeasureErrorStd;
  KalmanFilterBase::KalmanFilterBase(&this_00->super_KalmanFilterBase,4,2,4);
  (this->filter_).super_KalmanFilterBase.super_ZeroDelayObserver.super_ObserverBase.
  _vptr_ObserverBase = (_func_int **)&PTR__LinearKalmanFilter_001b5348;
  (this->filter_).super_KalmanFilterBase.super_StateVectorArithmetics._vptr_StateVectorArithmetics =
       (_func_int **)&PTR_stateSum_001b55a8;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  pMVar8 = &this->A_;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[0] = 1.0;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[1] = 0.0;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[2] = 0.0;
  (this->previousOrientation_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
  m_storage.m_data.array[3] = 1.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xb] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xc] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xd] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xe] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xf] = 0.0;
  lVar11 = 0x340;
  do {
    (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0]
         = 1.0;
    lVar11 = lVar11 + 0x20;
    pMVar8 = (Matrix4 *)
             ((pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
              m_data.array + 5);
  } while (lVar11 != 0x3c0);
  pMVar8 = &this->Q_;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xe] = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xf] = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xc] = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xd] = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xb] = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = 0.0;
  (this->B_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xe] = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xf] = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xc] = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xd] = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xb] = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
       = 0.0;
  lVar11 = 0x4a0;
  do {
    (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0]
         = 1.0;
    lVar11 = lVar11 + 0x20;
    pMVar8 = (Matrix4 *)
             ((pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
              m_data.array + 5);
  } while (lVar11 != 0x520);
  updateMatricesABQ_(this);
  local_148.m_data = (double *)&this->C_;
  local_148.m_rows = 0;
  local_148.m_cols = 2;
  local_130[0] = 2;
  lVar11 = 0;
  pMVar9 = (Matrix24 *)local_148.m_data;
  do {
    lVar12 = 0;
    do {
      dVar14 = 1.0;
      if (lVar11 != lVar12) {
        dVar14 = 0.0;
      }
      (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>).m_storage.m_data.array
      [lVar12] = dVar14;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 2);
    lVar11 = lVar11 + 1;
    pMVar9 = (Matrix24 *)
             ((pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>).m_storage.
              m_data.array + 2);
  } while (lVar11 != 2);
  Eigen::CommaInitializer<Eigen::Matrix<double,2,4,0,2,4>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,4,0,2,4>> *)&local_148,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              *)&local_98);
  if ((local_130[0] + local_148.m_rows != 2) || (local_148.m_cols != 4)) {
    pcVar10 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 4>>::finished() [MatrixType = Eigen::Matrix<double, 2, 4>]"
    ;
    goto LAB_0017da26;
  }
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0]
       = local_c0 * local_c0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1]
       = 0.0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
       = 0.0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
       = local_c0 * local_c0;
  local_148.m_data = (double *)0x0;
  local_148.m_rows = 0;
  local_148.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_148,8,2,4);
  if ((local_148.m_rows != 2) || (local_148.m_cols != 4)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_148,8,2,4);
  }
  if ((local_148.m_rows == 2) && (local_148.m_cols == 4)) {
    uVar13 = 0xfffffffffffffffe;
    do {
      pdVar1 = (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.
               m_data.array + uVar13 + 2;
      dVar14 = pdVar1[1];
      *(double *)((long)local_148.m_data + uVar13 * 8 + 0x10) = *pdVar1;
      *(double *)
       ((DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
         *)((long)local_148.m_data + uVar13 * 8 + 0x10) + 8) = dVar14;
      uVar13 = uVar13 + 2;
    } while (uVar13 < 6);
    KalmanFilterBase::setC(&this_00->super_KalmanFilterBase,(Cmatrix *)&local_148);
    free(local_148.m_data);
    local_148.m_data = (double *)0x0;
    local_148.m_rows = 0;
    local_148.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_148,4,2,2);
    if ((local_148.m_rows != 2) || (local_148.m_cols != 2)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_148,4,2,2);
    }
    if ((local_148.m_rows == 2) && (local_148.m_cols == 2)) {
      lVar11 = 0;
      do {
        pdVar1 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                 m_data.array + lVar11;
        dVar14 = pdVar1[1];
        *(double *)((long)local_148.m_data + lVar11 * 8) = *pdVar1;
        *(double *)
         ((DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
           *)((long)local_148.m_data + lVar11 * 8) + 8) = dVar14;
        lVar11 = lVar11 + 2;
      } while (lVar11 == 2);
      (*(this_00->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.
        _vptr_ObserverBase[0x2e])(this_00,&local_148);
      free(local_148.m_data);
      local_148.m_rows = 0;
      local_148.m_cols = 1;
      local_130[0] = 2;
      local_98 = (initDcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[0];
      adStack_90[0] =
           (initDcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
           array[1];
      local_148.m_data = &local_98;
      Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_148,
                 (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initBias);
      if ((local_130[0] + local_148.m_rows == 4) && (local_148.m_cols == 1)) {
        local_148.m_data = (double *)0x0;
        local_148.m_rows = 0;
        free((void *)0x0);
        pDVar5 = (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                  *)malloc(0x20);
        if (((ulong)pDVar5 & 0xf) != 0) {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                        "void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pDVar5 == (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                       *)0x0) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = operator_delete;
          __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        local_148.m_data = (double *)pDVar5;
        local_148.m_rows = 4;
        lVar11 = 0;
        do {
          dVar14 = adStack_90[lVar11];
          *(double *)(pDVar5 + lVar11 * 8) = adStack_90[lVar11 + -1];
          *(double *)(pDVar5 + lVar11 * 8 + 8) = dVar14;
          lVar11 = lVar11 + 2;
        } while (lVar11 == 2);
        ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)&local_148,0);
        free(local_148.m_data);
        dVar14 = (local_c8->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[0];
        dVar2 = (local_c8->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                m_data.array[1];
        local_b8[1] = 0.0;
        local_b8[2] = 0.0;
        local_b8[0] = dVar14 * dVar14;
        local_b8[3] = dVar2 * dVar2;
        local_168.m_rows = 0;
        local_168.m_cols = 2;
        local_150 = 2;
        lVar11 = 0;
        do {
          uVar3 = *(undefined8 *)((long)local_b8 + lVar11 + 8);
          *(undefined8 *)((long)&local_148.m_data + lVar11 * 2) =
               *(undefined8 *)((long)local_b8 + lVar11);
          *(undefined8 *)((long)local_130 + lVar11 * 2 + -0x10) = uVar3;
          lVar11 = lVar11 + 0x10;
        } while (lVar11 != 0x20);
        local_60 = 0;
        local_168.m_data = (double *)&local_148;
        pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_168,local_68
                           );
        local_70 = 0;
        pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar6,local_78);
        local_58[0] = (initBiasUncertainty->
                      super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                      .array[0];
        local_58[3] = (initBiasUncertainty->
                      super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                      .array[1];
        local_58[0] = local_58[0] * local_58[0];
        local_58[3] = local_58[3] * local_58[3];
        local_58[1] = 0.0;
        local_58[2] = 0.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar6,
                   (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_58);
        if ((local_150 + local_168.m_rows == 4) && (local_168.m_cols == 4)) {
          local_168.m_data = (double *)0x0;
          local_168.m_rows = 0;
          local_168.m_cols = 0;
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_168,0x10,4,4);
          if ((local_168.m_rows != 4) || (local_168.m_cols != 4)) {
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_168,0x10,4,4);
          }
          if ((local_168.m_rows == 4) && (local_168.m_cols == 4)) {
            uVar13 = 0xfffffffffffffffe;
            do {
              IVar4 = local_130[uVar13];
              ((Index *)((long)local_168.m_data + 0x10))[uVar13] = local_130[uVar13 - 1];
              ((Index *)((long)local_168.m_data + 0x10) + uVar13)[1] = IVar4;
              uVar13 = uVar13 + 2;
            } while (uVar13 < 0xe);
            KalmanFilterBase::setStateCovariance
                      (&this_00->super_KalmanFilterBase,(Pmatrix *)&local_168);
            free(local_168.m_data);
            return;
          }
          pcVar10 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 4, 4>, T1 = double, T2 = double]"
          ;
          goto LAB_0017d98d;
        }
        pcVar10 = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
        ;
      }
      else {
        pcVar10 = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 1>>::finished() [MatrixType = Eigen::Matrix<double, 4, 1>]"
        ;
      }
LAB_0017da26:
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar10);
    }
    pcVar10 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 2, 2>, T1 = double, T2 = double]"
    ;
  }
  else {
    pcVar10 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 2, 4>, T1 = double, T2 = double]"
    ;
  }
LAB_0017d98d:
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar10);
}

Assistant:

LipmDcmEstimator::LipmDcmEstimator(double dt,
                                   double omega_0,
                                   double biasDriftStd,
                                   double dcmMeasureErrorStd,
                                   double zmpMeasureErrorStd,
                                   const Vector2 & biasLimit,
                                   const Vector2 & initZMP,
                                   const Vector2 & initDcm,
                                   const Vector2 & initBias,
                                   const Vector2 & initDcmUncertainty,
                                   const Vector2 & initBiasUncertainty)
: omega0_(omega_0), dt_(dt), biasDriftStd_(biasDriftStd), zmpErrorStd_(zmpMeasureErrorStd), previousZmp_(initZMP),
  biasLimit_(biasLimit), filter_(4, 2, 4), previousOrientation_(Matrix2::Identity())
{
  A_.setIdentity();
  B_.setZero();
  Q_.setIdentity();
  updateMatricesABQ_();
  C_ << Matrix2::Identity(), Matrix2::Identity();
  R_ = dblToSqDiag_(dcmMeasureErrorStd);
  filter_.setC(C_);
  filter_.setMeasurementCovariance(R_);
  Vector4 x;
  x << initDcm, initBias;
  filter_.setState(x, 0);
  Matrix4 P;
  // clang-format off
  P<< Vec2ToSqDiag_(initDcmUncertainty),  Matrix2::Zero(),
      Matrix2::Zero(),                   Vec2ToSqDiag_(initBiasUncertainty);
  // clang-format on
  filter_.setStateCovariance(P);
}